

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

void __thiscall Potassco::AspifTextInput::matchStr(AspifTextInput *this)

{
  char cVar1;
  BufferedStream *pBVar2;
  byte bVar3;
  
  match(this,"\"",true);
  cVar1 = '\"';
  bVar3 = 0;
  while( true ) {
    push(this,cVar1);
    pBVar2 = ProgramReader::stream(&this->super_ProgramReader);
    cVar1 = pBVar2->buf_[pBVar2->rpos_];
    if ((cVar1 == '\0') || (!(bool)(cVar1 != '\"' | bVar3))) break;
    bVar3 = (bVar3 ^ 1) & cVar1 == '\\';
    pBVar2 = ProgramReader::stream(&this->super_ProgramReader);
    cVar1 = BufferedStream::get(pBVar2);
  }
  match(this,"\"",true);
  push(this,'\"');
  return;
}

Assistant:

void AspifTextInput::matchStr() {
	match("\""), push('"');
	bool quoted = false;
	for (char c; (c = stream()->peek()) != 0 && (c != '\"' || quoted);) {
		quoted = !quoted && c == '\\';
		push(stream()->get());
	}
	match("\""), push('"');
}